

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::keep_alive(socket_t sock,time_t keep_alive_timeout_sec)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  bool bVar6;
  fd_set fds;
  timeval local_c8;
  timespec local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (0x3ff < sock) {
    return true;
  }
  iVar1 = sock + 0x3f;
  if (-1 < sock) {
    iVar1 = sock;
  }
  do {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.tv_sec = 0;
    local_b8.tv_nsec = 0;
    (&local_b8.tv_sec)[iVar1 >> 6] = (&local_b8.tv_sec)[iVar1 >> 6] | 1L << ((byte)sock & 0x3f);
    local_c8.tv_sec = 0;
    local_c8.tv_usec = 10000;
    while( true ) {
      iVar2 = select(sock + 1,(fd_set *)&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
      bVar6 = iVar2 != 0;
      if (-1 < iVar2) break;
      piVar4 = __errno_location();
      if (*piVar4 != 4) {
        return false;
      }
    }
    if (bVar6) {
      return bVar6;
    }
    lVar5 = std::chrono::_V2::steady_clock::now();
    if (keep_alive_timeout_sec * 1000 < (lVar5 - lVar3) / 1000000) {
      return bVar6;
    }
    local_b8.tv_sec = 0;
    local_b8.tv_nsec = 1000000;
    do {
      iVar2 = nanosleep(&local_b8,&local_b8);
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  } while( true );
}

Assistant:

inline bool keep_alive(socket_t sock, time_t keep_alive_timeout_sec) {
  using namespace std::chrono;
  auto start = steady_clock::now();
  while (true) {
    auto val = select_read(sock, 0, 10000);
    if (val < 0) {
      return false;
    } else if (val == 0) {
      auto current = steady_clock::now();
      auto duration = duration_cast<milliseconds>(current - start);
      auto timeout = keep_alive_timeout_sec * 1000;
      if (duration.count() > timeout) { return false; }
      std::this_thread::sleep_for(std::chrono::milliseconds(1));
    } else {
      return true;
    }
  }
}